

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::crate::CrateReader::ReadArray<tinyusdz::Reference>
          (CrateReader *this,vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *d)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_648 [8];
  Reference p;
  size_t i;
  ostringstream local_4d0 [8];
  ostringstream ss_e_2;
  string local_358;
  ostringstream local_338 [8];
  ostringstream ss_e_1;
  string local_1c0;
  ostringstream local_1a0 [8];
  ostringstream ss_e;
  uint64_t local_28;
  uint64_t n;
  vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *d_local;
  CrateReader *this_local;
  
  if (d == (vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    local_28 = 0;
    n = (uint64_t)d;
    d_local = (vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)this;
    bVar1 = StreamReader::read8(this->_sr,&local_28);
    if (bVar1) {
      if ((this->_config).maxArrayElements < local_28) {
        ::std::__cxx11::ostringstream::ostringstream(local_338);
        poVar2 = ::std::operator<<((ostream *)local_338,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,"[Crate]");
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ReadArray");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x5f2);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)local_338,"Too many array elements.");
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_358);
        ::std::__cxx11::string::~string((string *)&local_358);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_338);
      }
      else {
        this->_memoryUsage = local_28 * 0x150 + this->_memoryUsage;
        if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
          ::std::__cxx11::ostringstream::ostringstream(local_4d0);
          poVar2 = ::std::operator<<((ostream *)local_4d0,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,"[Crate]");
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ReadArray");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x5f5);
          ::std::operator<<(poVar2," ");
          poVar2 = ::std::operator<<((ostream *)local_4d0,"Reached to max memory budget.");
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)&i);
          ::std::__cxx11::string::~string((string *)&i);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_4d0);
        }
        else {
          for (p.customData._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              p.customData._M_t._M_impl.super__Rb_tree_header._M_node_count < local_28;
              p.customData._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   p.customData._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
            Reference::Reference((Reference *)local_648);
            bVar1 = ReadReference(this,(Reference *)local_648);
            if (bVar1) {
              ::std::vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>>::
              emplace_back<tinyusdz::Reference&>
                        ((vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>> *)n,
                         (Reference *)local_648);
            }
            else {
              this_local._7_1_ = 0;
            }
            Reference::~Reference((Reference *)local_648);
            if (!bVar1) goto LAB_0023fc25;
          }
          this_local._7_1_ = 1;
        }
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_1a0);
      poVar2 = ::std::operator<<((ostream *)local_1a0,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,"[Crate]");
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadArray");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x5ed);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_1a0,"Failed to read the number of array elements."
                                );
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_1c0);
      ::std::__cxx11::string::~string((string *)&local_1c0);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
    }
  }
LAB_0023fc25:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::ReadArray(std::vector<Reference> *d) {

  if (!d) {
    return false;
  }

  uint64_t n{0};
  if (!_sr->read8(&n)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
    return false;
  }

  if (n > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many array elements.");
  }

  CHECK_MEMORY_USAGE(sizeof(Reference) * n);

  for (size_t i = 0; i < n; i++) {
    Reference p;
    if (!ReadReference(&p)) {
      return false;
    }
    d->emplace_back(p);
  }

  return true;
}